

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbssurface.cpp
# Opt level: O0

bool __thiscall ON_NurbsSurface::Read(ON_NurbsSurface *this,ON_BinaryArchive *file)

{
  ON_BinaryArchive *this_00;
  int iVar1;
  double *p;
  byte local_92;
  byte local_91;
  int local_88;
  int local_84;
  int j;
  int i;
  int cv_size;
  int count;
  ON_BoundingBox bbox;
  ON__INT32 local_40;
  int reserved2;
  int reserved1;
  int cv_count1;
  int cv_count0;
  int order1;
  int order0;
  int is_rat;
  int dim;
  int iStack_1c;
  bool rc;
  int minor_version;
  int major_version;
  ON_BinaryArchive *file_local;
  ON_NurbsSurface *this_local;
  
  _minor_version = file;
  file_local = (ON_BinaryArchive *)this;
  ON_Surface::DestroySurfaceTree(&this->super_ON_Surface);
  iStack_1c = 0;
  dim = 0;
  is_rat._3_1_ = ON_BinaryArchive::Read3dmChunkVersion(_minor_version,&stack0xffffffffffffffe4,&dim)
  ;
  if (((bool)is_rat._3_1_) && (iStack_1c == 1)) {
    order0 = 0;
    order1 = 0;
    cv_count0 = 0;
    cv_count1 = 0;
    reserved1 = 0;
    reserved2 = 0;
    local_40 = 0;
    bbox.m_max.z._4_4_ = 0;
    if ((bool)is_rat._3_1_) {
      is_rat._3_1_ = ON_BinaryArchive::ReadInt(_minor_version,&order0);
    }
    if ((bool)is_rat._3_1_ != false) {
      is_rat._3_1_ = ON_BinaryArchive::ReadInt(_minor_version,&order1);
    }
    if ((bool)is_rat._3_1_ != false) {
      is_rat._3_1_ = ON_BinaryArchive::ReadInt(_minor_version,&cv_count0);
    }
    if ((bool)is_rat._3_1_ != false) {
      is_rat._3_1_ = ON_BinaryArchive::ReadInt(_minor_version,&cv_count1);
    }
    if ((bool)is_rat._3_1_ != false) {
      is_rat._3_1_ = ON_BinaryArchive::ReadInt(_minor_version,&reserved1);
    }
    if ((bool)is_rat._3_1_ != false) {
      is_rat._3_1_ = ON_BinaryArchive::ReadInt(_minor_version,&reserved2);
    }
    if ((bool)is_rat._3_1_ != false) {
      is_rat._3_1_ = ON_BinaryArchive::ReadInt(_minor_version,&local_40);
    }
    if ((bool)is_rat._3_1_ != false) {
      is_rat._3_1_ = ON_BinaryArchive::ReadInt
                               (_minor_version,(ON__INT32 *)((long)&bbox.m_max.z + 4));
    }
    if ((bool)is_rat._3_1_ != false) {
      ON_BoundingBox::ON_BoundingBox((ON_BoundingBox *)&cv_size);
      is_rat._3_1_ = ON_BinaryArchive::ReadBoundingBox(_minor_version,(ON_BoundingBox *)&cv_size);
    }
    Create(this,order0,order1 != 0,cv_count0,cv_count1,reserved1,reserved2);
    i = 0;
    if ((is_rat._3_1_ & 1) != 0) {
      is_rat._3_1_ = ON_BinaryArchive::ReadInt(_minor_version,&i);
    }
    if (((is_rat._3_1_ & 1) != 0) && (i < 0)) {
      is_rat._3_1_ = 0;
    }
    if ((is_rat._3_1_ & 1) != 0) {
      is_rat._3_1_ = ReserveKnotCapacity(this,0,i);
    }
    if ((is_rat._3_1_ & 1) != 0) {
      is_rat._3_1_ = ON_BinaryArchive::ReadDouble(_minor_version,(long)i,this->m_knot[0]);
    }
    i = 0;
    if ((is_rat._3_1_ & 1) != 0) {
      is_rat._3_1_ = ON_BinaryArchive::ReadInt(_minor_version,&i);
    }
    if (((is_rat._3_1_ & 1) != 0) && (i < 0)) {
      is_rat._3_1_ = 0;
    }
    if ((is_rat._3_1_ & 1) != 0) {
      is_rat._3_1_ = ReserveKnotCapacity(this,1,i);
    }
    if ((is_rat._3_1_ & 1) != 0) {
      is_rat._3_1_ = ON_BinaryArchive::ReadDouble(_minor_version,(long)i,this->m_knot[1]);
    }
    i = 0;
    if ((is_rat._3_1_ & 1) != 0) {
      is_rat._3_1_ = ON_BinaryArchive::ReadInt(_minor_version,&i);
    }
    if (((is_rat._3_1_ & 1) != 0) && (i < 0)) {
      is_rat._3_1_ = 0;
    }
    iVar1 = CVSize(this);
    if ((is_rat._3_1_ & 1) != 0) {
      is_rat._3_1_ = ReserveCVCapacity(this,i * iVar1);
    }
    if (((0 < i) && (0 < iVar1)) && ((is_rat._3_1_ & 1) != 0)) {
      local_84 = 0;
      while( true ) {
        local_91 = 0;
        if (local_84 < this->m_cv_count[0]) {
          local_91 = is_rat._3_1_;
        }
        if ((local_91 & 1) == 0) break;
        local_88 = 0;
        while( true ) {
          this_00 = _minor_version;
          local_92 = 0;
          if (local_88 < this->m_cv_count[1]) {
            local_92 = is_rat._3_1_;
          }
          if ((local_92 & 1) == 0) break;
          p = CV(this,local_84,local_88);
          is_rat._3_1_ = ON_BinaryArchive::ReadDouble(this_00,(long)iVar1,p);
          local_88 = local_88 + 1;
        }
        local_84 = local_84 + 1;
      }
    }
  }
  if ((is_rat._3_1_ & 1) == 0) {
    Destroy(this);
  }
  return (bool)(is_rat._3_1_ & 1);
}

Assistant:

bool ON_NurbsSurface::Read(
       ON_BinaryArchive&  file // open binary file
     )
{
  DestroySurfaceTree();
  // NOTE - check legacy I/O code if changed
  int major_version = 0;
  int minor_version = 0;
  bool rc = file.Read3dmChunkVersion(&major_version,&minor_version);
  if (rc && major_version==1) {
    // common to all 1.x versions
    int dim = 0, is_rat = 0, order0 = 0, order1 = 0, cv_count0 = 0, cv_count1 = 0;
    int reserved1 = 0, reserved2 = 0;
    if (rc) rc = file.ReadInt( &dim );
    if (rc) rc = file.ReadInt( &is_rat );
    if (rc) rc = file.ReadInt( &order0 );
    if (rc) rc = file.ReadInt( &order1 );
    if (rc) rc = file.ReadInt( &cv_count0 );
    if (rc) rc = file.ReadInt( &cv_count1 );

    if (rc) rc = file.ReadInt(&reserved1);
    if (rc) rc = file.ReadInt(&reserved2);

    if (rc) {
      ON_BoundingBox bbox; // read bounding box - may be used in future
      rc = file.ReadBoundingBox(bbox);
    }
    
    Create( dim, is_rat, order0, order1, cv_count0, cv_count1 );

    int count = 0;
    if (rc) rc = file.ReadInt(&count);
    if (rc && count < 0)
      rc = false;
    if (rc ) rc = ReserveKnotCapacity(0,count);
    if (rc) rc = file.ReadDouble( count, m_knot[0] );

    count = 0;
    if (rc) rc = file.ReadInt(&count);
    if (rc && count < 0)
      rc = false;
    if (rc ) rc = ReserveKnotCapacity(1,count);
    if (rc) rc = file.ReadDouble( count, m_knot[1] );

    count = 0;
    if (rc) rc = file.ReadInt(&count);
    if (rc && count < 0)
      rc = false;
    const int cv_size = CVSize();
    if (rc) rc = ReserveCVCapacity( count*cv_size );
    if (count > 0 && cv_size > 0 && rc ) {
      int i, j;
      for ( i = 0; i < m_cv_count[0] && rc; i++ ) {
        for ( j = 0; j < m_cv_count[1] && rc; j++ ) {
          rc = file.ReadDouble( cv_size, CV(i,j) );
        }
      }
    }
  }
  if ( !rc )
    Destroy();
  return rc;
}